

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O2

int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  Abc_NtkFunc_t AVar2;
  int iVar3;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar4;
  int iVar5;
  char *__s;
  Abc_Ntk_t *pAVar6;
  long lVar7;
  
  p = Vec_PtrAlloc(0);
  pAVar6 = pManMR->pInitNtk;
  if (pAVar6 == (Abc_Ntk_t *)0x0) {
    __assert_fail("pManMR->pInitNtk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                  ,0x22f,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
  }
  if (pManMR->fSolutionIsDc == 0) {
    for (iVar5 = 0; iVar5 < pAVar6->vObjs->nSize; iVar5 = iVar5 + 1) {
      pAVar4 = Abc_NtkObj(pAVar6,iVar5);
      if (pAVar4 != (Abc_Obj_t *)0x0) {
        uVar1 = *(uint *)&pAVar4->field_0x14 & 0xf;
        if (uVar1 == 4) {
          __assert_fail("!Abc_ObjIsBi(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                        ,0x23d,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
        }
        if (uVar1 == 5) {
          __assert_fail("!Abc_ObjIsBo(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                        ,0x23c,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
        }
        if (uVar1 == 8) {
          __assert_fail("!Abc_ObjIsLatch(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                        ,0x23b,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
        }
      }
      pAVar6 = pManMR->pInitNtk;
    }
    while (p->nSize != 0) {
      pAVar4 = (Abc_Obj_t *)Vec_PtrPop(p);
      Abc_NtkDeleteObj(pAVar4);
    }
    Vec_PtrFree(p);
    Abc_NtkAddDummyPoNames(pManMR->pInitNtk);
    Abc_NtkAddDummyPiNames(pManMR->pInitNtk);
    if (pManMR->pInitNtk->ntkType == ABC_NTK_LOGIC) {
      Abc_NtkCleanup(pManMR->pInitNtk,0);
    }
    if (pManMR->fVerbose != 0) {
      printf("\tsolving for init state (%d nodes)... ",(ulong)(uint)pManMR->pInitNtk->nObjs);
    }
    fflush(_stdout);
    pAVar6 = pManMR->pInitNtk;
    AVar2 = pAVar6->ntkFunc;
    if (AVar2 == ABC_FUNC_SOP) {
      Abc_NtkSopToBdd(pAVar6);
      pAVar6 = pManMR->pInitNtk;
      AVar2 = pAVar6->ntkFunc;
    }
    if (AVar2 == ABC_FUNC_AIG) {
      Abc_NtkAigToBdd(pAVar6);
      pAVar6 = pManMR->pInitNtk;
    }
    iVar5 = 0;
    iVar3 = Abc_NtkMiterSat(pAVar6,500000,50000000,0,(ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
    if (iVar3 == 0) {
      if (pManMR->fVerbose != 0) {
        puts("SUCCESS");
      }
      for (iVar5 = 0; iVar5 < pManMR->pInitNtk->vPis->nSize; iVar5 = iVar5 + 1) {
        pAVar4 = Abc_NtkPi(pManMR->pInitNtk,iVar5);
        (pAVar4->field_6).pTemp = (void *)0x0;
      }
      iVar5 = 0;
      do {
        if (pNtk->vBoxes->nSize <= iVar5) {
          pAVar6 = pManMR->pInitNtk;
          if (pAVar6->pModel == (int *)0x0) {
            __assert_fail("pManMR->pInitNtk->pModel",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                          ,0x27b,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
          }
          for (lVar7 = 0; lVar7 < pAVar6->vPis->nSize; lVar7 = lVar7 + 1) {
            pAVar4 = Abc_NtkPi(pAVar6,(int)lVar7);
            pAVar4 = (pAVar4->field_6).pCopy;
            if (pAVar4 != (Abc_Obj_t *)0x0) {
              if (pManMR->pInitNtk->pModel[lVar7] == 0) {
                Abc_LatchSetInit0(pAVar4);
              }
              else {
                Abc_LatchSetInit1(pAVar4);
              }
            }
            pAVar6 = pManMR->pInitNtk;
          }
          iVar5 = 0;
          while( true ) {
            if (pNtk->vBoxes->nSize <= iVar5) {
              return 1;
            }
            pAVar4 = Abc_NtkBox(pNtk,iVar5);
            if (((*(uint *)&pAVar4->field_0x14 & 0xf) == 8) &&
               ((pAVar4->field_5).pData == (void *)0x0)) break;
            iVar5 = iVar5 + 1;
          }
          __assert_fail("!Abc_LatchIsInitNone( pObj )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                        ,0x287,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
        }
        pAVar4 = Abc_NtkBox(pNtk,iVar5);
        if ((*(uint *)&pAVar4->field_0x14 & 0xf) == 8) {
          if ((*(uint *)((long)(pAVar4->field_5).pData + 0x14) & 0xf) != 2) {
            __assert_fail("Abc_ObjIsPi( pInitObj )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                          ,0x272,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
          }
          *(Abc_Obj_t **)((long)(pAVar4->field_5).pData + 0x40) = pAVar4;
          if ((*(uint *)&pAVar4->field_0x14 & 0xf) != 8) {
            __assert_fail("Abc_ObjIsLatch(pLatch)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                          ,0x1a3,"void Abc_LatchSetInitNone(Abc_Obj_t *)");
          }
          (pAVar4->field_5).pData = (void *)0x0;
        }
        iVar5 = iVar5 + 1;
      } while( true );
    }
    if (pManMR->fVerbose == 0) {
      return 0;
    }
    __s = "FAILURE";
  }
  else {
    Vec_PtrFree(p);
    for (iVar5 = 0; iVar5 < pNtk->vBoxes->nSize; iVar5 = iVar5 + 1) {
      pAVar4 = Abc_NtkBox(pNtk,iVar5);
      if ((*(uint *)&pAVar4->field_0x14 & 0xf) == 8) {
        Abc_LatchSetInitDc(pAVar4);
      }
    }
    iVar5 = 1;
    if (pManMR->fVerbose == 0) {
      return 1;
    }
    __s = "\tno init state computation: all-don\'t-care solution";
  }
  puts(__s);
  return iVar5;
}

Assistant:

int Abc_FlowRetime_SolveBackwardInit( Abc_Ntk_t * pNtk ) {
  int i;
  Abc_Obj_t *pObj, *pInitObj;
  Vec_Ptr_t *vDelete = Vec_PtrAlloc(0);
  Abc_Ntk_t *pSatNtk;
  int result;

  assert(pManMR->pInitNtk);

  // is the solution entirely DC's?
  if (pManMR->fSolutionIsDc) {
    Vec_PtrFree(vDelete);
    Abc_NtkForEachLatch( pNtk, pObj, i ) Abc_LatchSetInitDc( pObj );
    vprintf("\tno init state computation: all-don't-care solution\n");
    return 1;
  }

  // check that network is combinational
  Abc_NtkForEachObj( pManMR->pInitNtk, pObj, i ) {
    assert(!Abc_ObjIsLatch(pObj));
    assert(!Abc_ObjIsBo(pObj));
    assert(!Abc_ObjIsBi(pObj));
  }
  
  // delete superfluous nodes
  while(Vec_PtrSize( vDelete )) {
    pObj = (Abc_Obj_t *)Vec_PtrPop( vDelete );
    Abc_NtkDeleteObj( pObj );
  }
  Vec_PtrFree(vDelete);

  // do some final cleanup on the network
  Abc_NtkAddDummyPoNames(pManMR->pInitNtk);
  Abc_NtkAddDummyPiNames(pManMR->pInitNtk);
  if (Abc_NtkIsLogic(pManMR->pInitNtk))
    Abc_NtkCleanup(pManMR->pInitNtk, 0);

#if defined(DEBUG_PRINT_INIT_NTK)
  Abc_NtkLevelReverse( pManMR->pInitNtk );
  Abc_NtkForEachObj( pManMR->pInitNtk, pObj, i ) 
    if (Abc_ObjLevel( pObj ) < 2)
      Abc_ObjPrint(stdout, pObj);
#endif
  
  vprintf("\tsolving for init state (%d nodes)... ", Abc_NtkObjNum(pManMR->pInitNtk));
  fflush(stdout);
#ifdef ABC_USE_CUDD
  // convert SOPs to BDD
  if (Abc_NtkHasSop(pManMR->pInitNtk))
    Abc_NtkSopToBdd( pManMR->pInitNtk );
  // convert AIGs to BDD
  if (Abc_NtkHasAig(pManMR->pInitNtk))
    Abc_NtkAigToBdd( pManMR->pInitNtk );
#else
  // convert SOPs to AIG
  if (Abc_NtkHasSop(pManMR->pInitNtk))
    Abc_NtkSopToAig( pManMR->pInitNtk );
#endif
  pSatNtk = pManMR->pInitNtk;
  
  // solve
  result = Abc_NtkMiterSat( pSatNtk, (ABC_INT64_T)500000, (ABC_INT64_T)50000000, 0, NULL, NULL );

  if (!result) { 
    vprintf("SUCCESS\n");
  } else  {    
    vprintf("FAILURE\n");
    return 0;
  }

  // clear initial values, associate PIs to latches
  Abc_NtkForEachPi( pManMR->pInitNtk, pInitObj, i ) Abc_ObjSetCopy( pInitObj, NULL );
  Abc_NtkForEachLatch( pNtk, pObj, i ) {
    pInitObj = (Abc_Obj_t*)Abc_ObjData( pObj );
    assert( Abc_ObjIsPi( pInitObj ));
    Abc_ObjSetCopy( pInitObj, pObj );
    Abc_LatchSetInitNone( pObj );

    // DEBUG
    // printf("solve : getting latch %d from PI %d\n", pObj->Id, pInitObj->Id);
  }

  // copy solution from PIs to latches
  assert(pManMR->pInitNtk->pModel);
  Abc_NtkForEachPi( pManMR->pInitNtk, pInitObj, i ) {
    if ((pObj = Abc_ObjCopy( pInitObj ))) {
      if ( pManMR->pInitNtk->pModel[i] )
        Abc_LatchSetInit1( pObj );
      else
        Abc_LatchSetInit0( pObj );
    }
  }

#if defined(DEBUG_CHECK)
  // check that all latches have initial state
  Abc_NtkForEachLatch( pNtk, pObj, i ) assert( !Abc_LatchIsInitNone( pObj ) );
#endif

  return 1;
}